

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

int duckdb_fmt::v6::internal::snprintf_float<long_double>
              (longdouble value,int precision,float_specs specs,buffer<char> *buf)

{
  char *__s;
  char cVar1;
  char *pcVar2;
  int iVar3;
  bool bVar4;
  long lVar5;
  char *pcVar6;
  uint uVar7;
  undefined2 *puVar8;
  char *pcVar9;
  byte bVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  byte bVar14;
  long lVar15;
  int iVar16;
  char *pcVar17;
  ulong unaff_R12;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  int iVar21;
  char format [7];
  char local_6b;
  undefined1 local_6a [2];
  undefined1 local_68 [4];
  uint local_64;
  long local_60;
  size_t local_58;
  longdouble local_4c;
  long local_40;
  ulong local_38;
  
  local_4c = value;
  local_38 = (ulong)specs >> 0x20;
  uVar7 = 5;
  if (-1 < precision) {
    uVar7 = precision - 1;
  }
  bVar14 = specs._4_1_;
  uVar19 = (ulong)uVar7;
  if (1 < bVar14) {
    uVar19 = (ulong)(uint)precision;
  }
  local_6b = '%';
  if ((specs._4_4_ >> 0x1d & 1) == 0) {
    puVar8 = (undefined2 *)local_6a;
  }
  else {
    puVar8 = (undefined2 *)(local_6a + 1);
    local_6a[0] = 0x23;
  }
  iVar18 = (int)uVar19;
  if (-1 < iVar18) {
    *puVar8 = 0x2a2e;
    puVar8 = puVar8 + 1;
  }
  *(undefined1 *)puVar8 = 0x4c;
  if (bVar14 == 3) {
    bVar10 = ((specs._4_4_ >> 0x18 & 1) == 0) << 5 | 0x41;
  }
  else {
    bVar10 = (bVar14 == 2) + 0x65;
  }
  *(byte *)((long)puVar8 + 1) = bVar10;
  *(undefined1 *)(puVar8 + 1) = 0;
  local_58 = buf->size_;
  local_60 = local_58 + 1;
  local_40 = local_58 - 2;
  local_64 = (uint)bVar14;
  do {
    pcVar2 = buf->ptr_;
    __s = pcVar2 + local_58;
    uVar13 = buf->capacity_ - local_58;
    if (iVar18 < 0) {
      uVar7 = snprintf(__s,uVar13,&local_6b);
    }
    else {
      uVar7 = snprintf(__s,uVar13,&local_6b,uVar19);
    }
    uVar20 = (ulong)uVar7;
    if ((int)uVar7 < 0) {
      bVar4 = true;
      if (buf->capacity_ != 0xffffffffffffffff) {
        (**buf->_vptr_buffer)(buf,buf->capacity_ + 1);
      }
    }
    else if (uVar20 < uVar13) {
      if ((char)local_38 == '\x02') {
        if (iVar18 == 0) goto LAB_01c97edf;
        unaff_R12 = 1;
        lVar11 = -0x100000000;
        do {
          lVar11 = lVar11 + 0x100000000;
          lVar5 = unaff_R12 + (uVar20 - 2);
          unaff_R12 = unaff_R12 - 1;
        } while ((byte)(__s[lVar5] - 0x30U) < 10);
        memmove(__s + unaff_R12 + uVar20 + -1,__s + unaff_R12 + uVar20,lVar11 >> 0x20);
        uVar13 = (ulong)(uVar7 - 1);
        if (buf->capacity_ < uVar13) {
          (**buf->_vptr_buffer)(buf,uVar13);
        }
        buf->size_ = uVar13;
        bVar4 = false;
      }
      else if (local_64 == 3) {
        uVar20 = uVar20 + local_58;
LAB_01c97edf:
        if (buf->capacity_ < uVar20) {
          (**buf->_vptr_buffer)(buf,uVar20);
        }
        buf->size_ = uVar20;
        bVar4 = false;
        unaff_R12 = 0;
      }
      else {
        uVar13 = 1;
        pcVar2 = pcVar2 + uVar20 + local_40;
        lVar11 = (uVar20 << 0x20) + -0x200000000;
        lVar5 = 1;
        pcVar6 = __s;
        iVar16 = uVar7 - 2;
        do {
          iVar21 = iVar16;
          pcVar17 = pcVar6;
          lVar15 = lVar5;
          lVar12 = lVar11;
          pcVar9 = pcVar2;
          uVar13 = uVar13 + 1;
          pcVar2 = pcVar9 + -1;
          lVar11 = lVar12 + -0x100000000;
          lVar5 = lVar15 + -1;
          pcVar6 = pcVar17 + -1;
          iVar16 = iVar21 + -1;
        } while (pcVar17[uVar20 - 1] != 'e');
        iVar16 = 0;
        do {
          iVar16 = (int)__s[lVar15 + uVar20] + iVar16 * 10 + -0x30;
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0);
        iVar3 = -iVar16;
        if (pcVar17[uVar20] != '-') {
          iVar3 = iVar16;
        }
        iVar16 = 0;
        if (uVar20 != uVar13) {
          iVar16 = iVar21;
          do {
            lVar12 = lVar12 + -0x100000000;
            iVar16 = iVar16 + -1;
            cVar1 = *pcVar9;
            pcVar9 = pcVar9 + -1;
          } while (cVar1 == '0');
          memmove(__s + 1,__s + 2,lVar12 >> 0x20);
        }
        uVar13 = iVar16 + local_60;
        if (buf->capacity_ < uVar13) {
          (**buf->_vptr_buffer)(buf,uVar13);
        }
        buf->size_ = uVar13;
        unaff_R12 = (ulong)(uint)(iVar3 - iVar16);
        bVar4 = false;
      }
    }
    else {
      bVar4 = true;
      if (buf->capacity_ < uVar20 + local_60) {
        (**buf->_vptr_buffer)(buf,uVar20 + local_60);
      }
    }
    if (!bVar4) {
      return (int)unaff_R12;
    }
  } while( true );
}

Assistant:

int snprintf_float(T value, int precision, float_specs specs,
                   buffer<char>& buf) {
  // Buffer capacity must be non-zero, otherwise MSVC's vsnprintf_s will fail.
  FMT_ASSERT(buf.capacity() > buf.size(), "empty buffer");
  static_assert(!std::is_same<T, float>(), "");

  // Subtract 1 to account for the difference in precision since we use %e for
  // both general and exponent format.
  if (specs.format == float_format::general ||
      specs.format == float_format::exp)
    precision = (precision >= 0 ? precision : 6) - 1;

  // Build the format string.
  enum { max_format_size = 7 };  // Ths longest format is "%#.*Le".
  char format[max_format_size];
  char* format_ptr = format;
  *format_ptr++ = '%';
  if (specs.trailing_zeros) *format_ptr++ = '#';
  if (precision >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }
  if (std::is_same<T, long double>()) *format_ptr++ = 'L';
  *format_ptr++ = specs.format != float_format::hex
                      ? (specs.format == float_format::fixed ? 'f' : 'e')
                      : (specs.upper ? 'A' : 'a');
  *format_ptr = '\0';

  // Format using snprintf.
  auto offset = buf.size();
  for (;;) {
    auto begin = buf.data() + offset;
    auto capacity = buf.capacity() - offset;
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
    if (precision > 100000)
      throw std::runtime_error(
          "fuzz mode - avoid large allocation inside snprintf");
#endif
    // Suppress the warning about a nonliteral format string.
    auto snprintf_ptr = FMT_SNPRINTF;
    int result = precision >= 0
                     ? snprintf_ptr(begin, capacity, format, precision, value)
                     : snprintf_ptr(begin, capacity, format, value);
    if (result < 0) {
      buf.reserve(buf.capacity() + 1);  // The buffer will grow exponentially.
      continue;
    }
    unsigned size = to_unsigned(result);
    // Size equal to capacity means that the last character was truncated.
    if (size >= capacity) {
      buf.reserve(size + offset + 1);  // Add 1 for the terminating '\0'.
      continue;
    }
    auto is_digit = [](char c) { return c >= '0' && c <= '9'; };
    if (specs.format == float_format::fixed) {
      if (precision == 0) {
        buf.resize(size);
        return 0;
      }
      // Find and remove the decimal point.
      auto end = begin + size, p = end;
      do {
        --p;
      } while (is_digit(*p));
      int fraction_size = static_cast<int>(end - p - 1);
      std::memmove(p, p + 1, fraction_size);
      buf.resize(size - 1);
      return -fraction_size;
    }
    if (specs.format == float_format::hex) {
      buf.resize(size + offset);
      return 0;
    }
    // Find and parse the exponent.
    auto end = begin + size, exp_pos = end;
    do {
      --exp_pos;
    } while (*exp_pos != 'e');
    char sign = exp_pos[1];
    assert(sign == '+' || sign == '-');
    int exp = 0;
    auto p = exp_pos + 2;  // Skip 'e' and sign.
    do {
      assert(is_digit(*p));
      exp = exp * 10 + (*p++ - '0');
    } while (p != end);
    if (sign == '-') exp = -exp;
    int fraction_size = 0;
    if (exp_pos != begin + 1) {
      // Remove trailing zeros.
      auto fraction_end = exp_pos - 1;
      while (*fraction_end == '0') --fraction_end;
      // Move the fractional part left to get rid of the decimal point.
      fraction_size = static_cast<int>(fraction_end - begin - 1);
      std::memmove(begin + 1, begin + 2, fraction_size);
    }
    buf.resize(fraction_size + offset + 1);
    return exp - fraction_size;
  }
}